

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QString *labelText,QWidget *field)

{
  bool bVar1;
  QWidget *label;
  
  if (field != (QWidget *)0x0) {
    bVar1 = QLayoutPrivate::checkWidget(*(QLayoutPrivate **)&(this->super_QLayout).field_0x8,field);
    if (!bVar1) {
      return;
    }
  }
  if ((labelText->d).size == 0) {
    label = (QWidget *)0x0;
  }
  else {
    label = (QWidget *)operator_new(0x28);
    QLabel::QLabel((QLabel *)label,labelText,(QWidget *)0x0,(WindowFlags)0x0);
    QLabel::setBuddy((QLabel *)label,field);
  }
  insertRow(this,row,label,field);
  return;
}

Assistant:

void QFormLayout::insertRow(int row, const QString &labelText, QWidget *field)
{
    Q_D(QFormLayout);
    if (field && !d->checkWidget(field))
        return;

    QLabel *label = nullptr;
    if (!labelText.isEmpty()) {
        label = new QLabel(labelText);
#ifndef QT_NO_SHORTCUT
        label->setBuddy(field);
#endif
    }
    insertRow(row, label, field);
}